

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

RGB __thiscall pbrt::PixelSensor::IlluminantToSensorRGB(PixelSensor *this,SpectrumHandle *illum)

{
  undefined1 auVar1 [16];
  Float FVar2;
  Float FVar3;
  Float FVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar5 [16];
  RGB RVar6;
  SpectrumHandle local_40;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_38;
  SpectrumHandle local_30;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_28;
  SpectrumHandle local_20;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_18;
  
  local_18.bits =
       (illum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_20.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&this->r_bar | 0x2000000000000);
  FVar2 = InnerProduct((SpectrumHandle *)&local_18,&local_20);
  local_28.bits =
       (illum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_30.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&this->g_bar | 0x2000000000000);
  FVar3 = InnerProduct((SpectrumHandle *)&local_28,&local_30);
  local_38.bits =
       (illum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_40.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&this->b_bar | 0x2000000000000);
  FVar4 = InnerProduct((SpectrumHandle *)&local_38,&local_40);
  auVar5._4_4_ = FVar3;
  auVar5._0_4_ = FVar3;
  auVar5._8_4_ = FVar3;
  auVar5._12_4_ = FVar3;
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = FVar2;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar1 = vblendps_avx(auVar5,auVar1,0xd);
  auVar1 = vdivps_avx(auVar1,auVar5);
  RVar6.b = FVar4 / FVar3;
  RVar6._0_8_ = auVar1._0_8_;
  return RVar6;
}

Assistant:

RGB IlluminantToSensorRGB(SpectrumHandle illum) const {
        RGB rgb(InnerProduct(illum, &r_bar), InnerProduct(illum, &g_bar),
                InnerProduct(illum, &b_bar));
        return rgb / rgb.g;
    }